

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  byte *pbVar9;
  int in_ESI;
  long in_RDI;
  U32 mls;
  U32 rowMask;
  U32 rowLog;
  U32 bound;
  U32 kMaxMatchEndPositionsToUpdate;
  U32 kMaxMatchStartPositionsToUpdate;
  U32 kSkipThreshold;
  U32 target;
  BYTE *base;
  U32 idx;
  U32 pos;
  BYTE *tagRow;
  U32 *row;
  U32 relRow;
  U32 hash;
  BYTE *base_1;
  U32 hashLog;
  BYTE *tagTable;
  U32 *hashTable;
  U32 pos_1;
  BYTE *tagRow_1;
  U32 *row_3;
  U32 relRow_1;
  U32 hash_3;
  BYTE *base_2;
  U32 hashLog_2;
  BYTE *tagTable_2;
  U32 *hashTable_2;
  U32 row_2;
  U32 hash_2;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog_1;
  BYTE *tagTable_1;
  U32 *hashTable_1;
  U32 hash_4;
  U32 row_4;
  U32 newHash_1;
  U32 hash_1;
  U32 row_1;
  U32 newHash;
  U32 next_1;
  U32 next;
  ulong in_stack_fffffffffffffc28;
  U32 h;
  void *in_stack_fffffffffffffc30;
  uint local_3c4;
  int local_35c;
  byte local_358;
  byte local_354;
  uint local_350;
  uint local_234;
  void *local_d0;
  uint local_b0;
  
  if (*(uint *)(in_RDI + 0x10c) < 6) {
    local_350 = *(uint *)(in_RDI + 0x10c);
  }
  else {
    local_350 = 6;
  }
  if (local_350 < 4) {
    local_354 = 4;
  }
  else {
    if (*(uint *)(in_RDI + 0x10c) < 6) {
      local_358 = (byte)*(undefined4 *)(in_RDI + 0x10c);
    }
    else {
      local_358 = 6;
    }
    local_354 = local_358;
  }
  uVar4 = (1 << (local_354 & 0x1f)) - 1;
  if (*(uint *)(in_RDI + 0x110) < 6) {
    local_35c = *(int *)(in_RDI + 0x110);
  }
  else {
    local_35c = 6;
  }
  local_234 = *(uint *)(in_RDI + 0x2c);
  uVar5 = in_ESI - (int)*(undefined8 *)(in_RDI + 8);
  if (local_234 <= uVar5) {
    lVar2 = *(long *)(in_RDI + 0x70);
    lVar3 = *(long *)(in_RDI + 0x38);
    iVar1 = *(int *)(in_RDI + 0x34);
    while( true ) {
      if (uVar5 <= local_234) {
        *(uint *)(in_RDI + 0x2c) = uVar5;
        return;
      }
      h = (U32)(in_stack_fffffffffffffc28 >> 0x20);
      if (0x20 < iVar1 + 8U) break;
      switch(local_35c) {
      default:
        sVar8 = ZSTD_hash4PtrS(in_stack_fffffffffffffc30,h,(U32)in_stack_fffffffffffffc28);
        local_b0 = (uint)sVar8;
        break;
      case 5:
        sVar8 = ZSTD_hash5PtrS(in_stack_fffffffffffffc30,h,0x279fc7);
        local_b0 = (uint)sVar8;
        break;
      case 6:
        sVar8 = ZSTD_hash6PtrS(in_stack_fffffffffffffc30,h,0x279fed);
        local_b0 = (uint)sVar8;
        break;
      case 7:
        sVar8 = ZSTD_hash7PtrS(in_stack_fffffffffffffc30,h,0x27a013);
        local_b0 = (uint)sVar8;
        break;
      case 8:
        sVar8 = ZSTD_hash8PtrS(in_stack_fffffffffffffc30,h,0x27a039);
        local_b0 = (uint)sVar8;
      }
      uVar6 = (local_b0 >> 8) << (local_354 & 0x1f);
      pbVar9 = (byte *)(lVar3 + (ulong)uVar6);
      uVar7 = *pbVar9 - 1 & uVar4;
      local_3c4 = uVar4;
      if (uVar7 != 0) {
        local_3c4 = 0;
      }
      local_3c4 = local_3c4 + uVar7;
      *pbVar9 = (byte)local_3c4;
      in_stack_fffffffffffffc30 = (void *)(ulong)local_b0;
      if (0x20 < iVar1 + 8U) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
      }
      in_stack_fffffffffffffc28 = (ulong)(local_35c - 4U);
      switch(in_stack_fffffffffffffc28) {
      default:
        local_d0 = (void *)ZSTD_hash4PtrS(in_stack_fffffffffffffc30,0,local_35c - 4U);
        break;
      case 1:
        local_d0 = (void *)ZSTD_hash5PtrS(in_stack_fffffffffffffc30,0,0x27a22a);
        break;
      case 2:
        local_d0 = (void *)ZSTD_hash6PtrS(in_stack_fffffffffffffc30,0,0x27a250);
        break;
      case 3:
        local_d0 = (void *)ZSTD_hash7PtrS(in_stack_fffffffffffffc30,0,0x27a276);
        break;
      case 4:
        local_d0 = (void *)ZSTD_hash8PtrS(in_stack_fffffffffffffc30,0,0x27a29c);
      }
      if (in_stack_fffffffffffffc30 != local_d0) {
        __assert_fail("hash == ZSTD_hashPtrSalted(base + updateStartIdx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls, ms->hashSalt)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x76e9,
                      "void ZSTD_row_update_internalImpl(ZSTD_matchState_t *, U32, const U32, const U32, const U32, const U32, const U32)"
                     );
      }
      pbVar9[local_3c4] = (byte)local_b0;
      *(uint *)(lVar2 + (ulong)uVar6 * 4 + (ulong)local_3c4 * 4) = local_234;
      local_234 = local_234 + 1;
    }
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
  }
  __assert_fail("target >= idx",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x770b,
                "void ZSTD_row_update_internal(ZSTD_matchState_t *, const BYTE *, const U32, const U32, const U32, const U32)"
               );
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* don't use cache */);
}